

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fixBoundingBox(Rtree *pRtree,RtreeNode *pNode)

{
  ushort uVar1;
  RtreeNode *pNode_00;
  int iVar2;
  uint iCell;
  RtreeCell cell;
  RtreeCell box;
  
  pNode_00 = pNode->pParent;
  if (pNode_00 != (RtreeNode *)0x0) {
    uVar1 = *(ushort *)(pNode->zData + 2);
    nodeGetCell(pRtree,pNode,0,&box);
    for (iCell = 1; iCell < (ushort)(uVar1 << 8 | uVar1 >> 8); iCell = iCell + 1) {
      nodeGetCell(pRtree,pNode,iCell,&cell);
      cellUnion(pRtree,&box,&cell);
    }
    box.iRowid = pNode->iNode;
    cell.iRowid._0_4_ = iCell;
    iVar2 = nodeParentIndex(pRtree,pNode,(int *)&cell);
    if (iVar2 == 0) {
      nodeOverwriteCell(pRtree,pNode_00,&box,(uint)cell.iRowid);
      iVar2 = fixBoundingBox(pRtree,pNode_00);
    }
    return iVar2;
  }
  return 0;
}

Assistant:

static int fixBoundingBox(Rtree *pRtree, RtreeNode *pNode){
  RtreeNode *pParent = pNode->pParent;
  int rc = SQLITE_OK; 
  if( pParent ){
    int ii; 
    int nCell = NCELL(pNode);
    RtreeCell box;                            /* Bounding box for pNode */
    nodeGetCell(pRtree, pNode, 0, &box);
    for(ii=1; ii<nCell; ii++){
      RtreeCell cell;
      nodeGetCell(pRtree, pNode, ii, &cell);
      cellUnion(pRtree, &box, &cell);
    }
    box.iRowid = pNode->iNode;
    rc = nodeParentIndex(pRtree, pNode, &ii);
    if( rc==SQLITE_OK ){
      nodeOverwriteCell(pRtree, pParent, &box, ii);
      rc = fixBoundingBox(pRtree, pParent);
    }
  }
  return rc;
}